

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

ncnn_layer_t ncnn_layer_create(void)

{
  ncnn_layer_t p_Var1;
  Layer *this;
  
  p_Var1 = (ncnn_layer_t)malloc(0x48);
  this = (Layer *)operator_new(0xd8);
  ncnn::Layer::Layer(this);
  this->_vptr_Layer = (_func_int **)&PTR__Layer_005c0070;
  this[1]._vptr_Layer = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->load_param = __ncnn_Layer_load_param;
  p_Var1->load_model = __ncnn_Layer_load_model;
  p_Var1->create_pipeline = __ncnn_Layer_create_pipeline;
  p_Var1->destroy_pipeline = __ncnn_Layer_destroy_pipeline;
  p_Var1->forward_1 = __ncnn_Layer_forward_1;
  p_Var1->forward_n = __ncnn_Layer_forward_n;
  p_Var1->forward_inplace_1 = __ncnn_Layer_forward_inplace_1;
  p_Var1->forward_inplace_n = __ncnn_Layer_forward_inplace_n;
  return p_Var1;
}

Assistant:

ncnn_layer_t ncnn_layer_create()
{
    ncnn_layer_t layer = (ncnn_layer_t)malloc(sizeof(__ncnn_layer_t));
    layer->pthis = (void*)(new Layer_c_api(layer));
    layer->load_param = __ncnn_Layer_load_param;
    layer->load_model = __ncnn_Layer_load_model;
    layer->create_pipeline = __ncnn_Layer_create_pipeline;
    layer->destroy_pipeline = __ncnn_Layer_destroy_pipeline;
    layer->forward_1 = __ncnn_Layer_forward_1;
    layer->forward_n = __ncnn_Layer_forward_n;
    layer->forward_inplace_1 = __ncnn_Layer_forward_inplace_1;
    layer->forward_inplace_n = __ncnn_Layer_forward_inplace_n;
    return layer;
}